

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapD.c
# Opt level: O2

Fxu_Double * Fxu_HeapDoubleGetMax(Fxu_HeapDouble *p)

{
  int iVar1;
  Fxu_Double **ppFVar2;
  Fxu_Double *pDiv;
  Fxu_Double *pFVar3;
  
  iVar1 = p->nItems;
  if ((long)iVar1 == 0) {
    pFVar3 = (Fxu_Double *)0x0;
  }
  else {
    ppFVar2 = p->pTree;
    pFVar3 = ppFVar2[1];
    pFVar3->HNum = 0;
    p->nItems = iVar1 + -1;
    ppFVar2[1] = ppFVar2[iVar1];
    pDiv = p->pTree[1];
    pDiv->HNum = 1;
    Fxu_HeapDoubleMoveDn(p,pDiv);
  }
  return pFVar3;
}

Assistant:

Fxu_Double * Fxu_HeapDoubleGetMax( Fxu_HeapDouble * p )
{
    Fxu_Double * pDiv;
    if ( p->nItems == 0 )
        return NULL;
    // prepare the return value
    pDiv = p->pTree[1];
    pDiv->HNum = 0;
    // put the last entry on top
    // decrement the number of entries
    p->pTree[1] = p->pTree[p->nItems--];
    p->pTree[1]->HNum = 1;
    // move the top entry down if necessary
    Fxu_HeapDoubleMoveDn( p, p->pTree[1] );
    return pDiv;     
}